

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O0

exp_number
ising::free_energy::square::transfer_matrix<double>::product_D
          (vector<double,_std::allocator<double>_> *diag,
          vector<double,_std::allocator<double>_> *diag_10,
          vector<double,_std::allocator<double>_> *diag_20,
          vector<double,_std::allocator<double>_> *diag_01,
          vector<double,_std::allocator<double>_> *diag_02,exp_number *factor,
          vector<double,_std::allocator<double>_> *v,vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double dVar9;
  exp_number<double> *peVar10;
  exp_number<double> eVar11;
  exp_number eVar12;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  uint_t c_1;
  double norm_inv;
  uint_t c;
  real_t_conflict norm2;
  uint_t dim;
  exp_number<double> *in_stack_fffffffffffffeb0;
  exp_number<double> *in_stack_fffffffffffffeb8;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_40;
  
  sVar6 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  local_40 = 0.0;
  for (local_48 = 0; local_48 < sVar6; local_48 = local_48 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,local_48);
    dVar9 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    dVar1 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,local_48);
    dVar2 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_48);
    dVar3 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_48);
    dVar4 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000020,local_48);
    dVar5 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000020,local_48);
    *pvVar8 = dVar4 * dVar5 + dVar9 * dVar1 + dVar2 * 2.0 * dVar3;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,local_48);
    dVar9 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    dVar1 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_48);
    dVar2 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_48);
    dVar3 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_48);
    *pvVar8 = dVar9 * dVar1 + dVar2 * dVar3;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R9,local_48);
    dVar9 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    dVar1 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,local_48);
    dVar2 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000028,local_48);
    dVar3 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_48);
    dVar4 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000030,local_48);
    dVar5 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000030,local_48);
    *pvVar8 = dVar4 * dVar5 + dVar9 * dVar1 + dVar2 * 2.0 * dVar3;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,local_48);
    dVar9 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    dVar1 = *pvVar8;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_48);
    dVar2 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000028,local_48);
    dVar3 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000028,local_48);
    *pvVar8 = dVar9 * dVar1 + dVar2 * dVar3;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_48);
    dVar9 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    dVar1 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    *pvVar8 = dVar9 * dVar1;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    dVar9 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_48);
    local_40 = dVar9 * *pvVar8 + local_40;
  }
  dVar9 = sqrt(local_40);
  peVar10 = (exp_number<double> *)(1.0 / dVar9);
  for (local_58 = 0; local_58 < sVar6; local_58 = local_58 + 1) {
    in_stack_fffffffffffffeb0 = peVar10;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000020,local_58);
    *pvVar8 = (double)in_stack_fffffffffffffeb0 * *pvVar8;
    in_stack_fffffffffffffeb8 = peVar10;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000018,local_58);
    *pvVar8 = (double)in_stack_fffffffffffffeb8 * *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000030,local_58);
    *pvVar8 = (double)peVar10 * *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000028,local_58);
    *pvVar8 = (double)peVar10 * *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_00000010,local_58);
    *pvVar8 = (double)peVar10 * *pvVar8;
  }
  eVar11 = standards::operator/(in_stack_fffffffffffffeb8,(double)in_stack_fffffffffffffeb0);
  eVar12.log_ = eVar11.log_;
  eVar12._8_8_ = in_RDI;
  return eVar12;
}

Assistant:

static exp_number product_D(
      std::vector<real_t> const &diag, std::vector<real_t> const &diag_10,
      std::vector<real_t> const &diag_20, std::vector<real_t> const &diag_01,
      std::vector<real_t> const &diag_02, exp_number factor,
      std::vector<real_t> &v, std::vector<real_t> &v_10,
      std::vector<real_t> &v_20, std::vector<real_t> &v_01,
      std::vector<real_t> &v_02) {
    uint_t dim = diag.size();
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] =
          diag_20[c] * v[c] + 2 * diag_10[c] * v_10[c] + diag[c] * v_20[c];
      v_10[c] = diag_10[c] * v[c] + diag[c] * v_10[c];
      v_02[c] =
          diag_02[c] * v[c] + 2 * diag_01[c] * v_01[c] + diag[c] * v_02[c];
      v_01[c] = diag_01[c] * v[c] + diag[c] * v_01[c];
      v[c] = diag[c] * v[c];
      norm2 += v[c] * v[c];
    }
    auto norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }